

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3VdbeDeleteAuxData(sqlite3 *db,AuxData **pp,int iOp,int mask)

{
  uint uVar1;
  AuxData *p;
  
  while (p = *pp, p != (AuxData *)0x0) {
    if ((iOp < 0) ||
       (((p->iAuxOp == iOp && (uVar1 = p->iAuxArg, -1 < (int)uVar1)) &&
        ((0x1f < uVar1 || (((uint)mask >> (uVar1 & 0x1f) & 1) == 0)))))) {
      if (p->xDeleteAux != (_func_void_void_ptr *)0x0) {
        (*p->xDeleteAux)(p->pAux);
      }
      *pp = p->pNextAux;
      sqlite3DbFreeNN(db,p);
    }
    else {
      pp = &p->pNextAux;
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VdbeDeleteAuxData(sqlite3 *db, AuxData **pp, int iOp, int mask){
  while( *pp ){
    AuxData *pAux = *pp;
    if( (iOp<0)
     || (pAux->iAuxOp==iOp
          && pAux->iAuxArg>=0
          && (pAux->iAuxArg>31 || !(mask & MASKBIT32(pAux->iAuxArg))))
    ){
      testcase( pAux->iAuxArg==31 );
      if( pAux->xDeleteAux ){
        pAux->xDeleteAux(pAux->pAux);
      }
      *pp = pAux->pNextAux;
      sqlite3DbFree(db, pAux);
    }else{
      pp= &pAux->pNextAux;
    }
  }
}